

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# machine_implementation.cc
# Opt level: O3

char ** testbench::machine::availability::begin(void)

{
  if ((anonymous_namespace)::machines != (undefined8 *)0x0) {
    return (char **)*(anonymous_namespace)::machines;
  }
  (anonymous_namespace)::machines = (undefined8 *)operator_new(0x30);
  *(anonymous_namespace)::machines = 0;
  (anonymous_namespace)::machines[1] = 0;
  (anonymous_namespace)::machines[2] = 0;
  (anonymous_namespace)::machines[3] = 0;
  (anonymous_namespace)::machines[2] = 0;
  (anonymous_namespace)::machines[3] = 0;
  (anonymous_namespace)::machines[4] = 0;
  (anonymous_namespace)::machines[5] = 0;
  return (char **)0x0;
}

Assistant:

static void factory_init()
{
    if (machines == nullptr) {
        machines = new machines_container;
    }
}